

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CoverCheck(Min_Man_t *p)

{
  uint local_1c;
  Min_Cube_t *pMStack_18;
  int i;
  Min_Cube_t *pCube;
  Min_Man_t *p_local;
  
  local_1c = 0;
  do {
    if (p->nVars < (int)local_1c) {
      return;
    }
    for (pMStack_18 = p->ppStore[(int)local_1c]; pMStack_18 != (Min_Cube_t *)0x0;
        pMStack_18 = pMStack_18->pNext) {
      if (local_1c != *(uint *)&pMStack_18->field_0x8 >> 0x16) {
        __assert_fail("i == (int)pCube->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinUtil.c"
                      ,0xe5,"void Min_CoverCheck(Min_Man_t *)");
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void Min_CoverCheck( Min_Man_t * p )
{
    Min_Cube_t * pCube;
    int i;
    for ( i = 0; i <= p->nVars; i++ )
        Min_CoverForEachCube( p->ppStore[i], pCube )
            assert( i == (int)pCube->nLits );
}